

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

_Bool borg_eat_food(wchar_t tval,wchar_t sval)

{
  wchar_t wVar1;
  char *what;
  
  wVar1 = borg_slot(tval,sval);
  if (L'\xffffffff' < wVar1) {
    what = format("# Eating %s.",borg_items + (uint)wVar1);
    borg_note(what);
    borg_keypress(0x45);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)wVar1]);
    goal_item = -1;
    goal_ware = -1;
    goal_shop = -1;
  }
  return L'\xffffffff' < wVar1;
}

Assistant:

bool borg_eat_food(int tval, int sval)
{
    int i;

    /* Look for that food */
    i = borg_slot(tval, sval);

    /* None available */
    if (i < 0)
        return (false);

    /* Log the message */
    borg_note(format("# Eating %s.", borg_items[i].desc));

    /* Perform the action */
    borg_keypress('E');
    borg_keypress(all_letters_nohjkl[i]);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}